

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 (*pauVar17) [16];
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [16];
  vint4 bi_2;
  undefined1 auVar28 [64];
  vint4 bi_4;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 ai_1;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 ai_3;
  undefined1 auVar39 [16];
  vint4 ai;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 ai_2;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 ai_4;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  vint4 bi_5;
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  vint4 bi;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1108 [16];
  ulong local_10f0;
  Intersectors *local_10e8;
  size_t local_10e0;
  Precalculations *local_10d8;
  RayHitK<4> *local_10d0;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined4 local_1048;
  undefined4 uStack_1044;
  undefined4 uStack_1040;
  undefined4 uStack_103c;
  undefined4 local_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_10d8 = pre;
  local_10e8 = This;
  pauVar27 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  local_1008 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1018._4_4_ = fVar1;
  local_1018._0_4_ = fVar1;
  local_1018._8_4_ = fVar1;
  local_1018._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1028._4_4_ = fVar2;
  local_1028._0_4_ = fVar2;
  local_1028._8_4_ = fVar2;
  local_1028._12_4_ = fVar2;
  local_1038 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uStack_1034 = local_1038;
  uStack_1030 = local_1038;
  uStack_102c = local_1038;
  local_1048 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  uStack_1044 = local_1048;
  uStack_1040 = local_1048;
  uStack_103c = local_1048;
  local_1058 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_1054 = local_1058;
  fStack_1050 = local_1058;
  fStack_104c = local_1058;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1068._4_4_ = fVar3;
  local_1068._0_4_ = fVar3;
  local_1068._8_4_ = fVar3;
  local_1068._12_4_ = fVar3;
  auVar47 = ZEXT1664(local_1068);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1078._4_4_ = fVar4;
  local_1078._0_4_ = fVar4;
  local_1078._8_4_ = fVar4;
  local_1078._12_4_ = fVar4;
  auVar48 = ZEXT1664(local_1078);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1088._4_4_ = fVar5;
  local_1088._0_4_ = fVar5;
  local_1088._8_4_ = fVar5;
  local_1088._12_4_ = fVar5;
  auVar50 = ZEXT1664(local_1088);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar6 = (tray->tnear).field_0.i[k];
  local_1098._4_4_ = iVar6;
  local_1098._0_4_ = iVar6;
  local_1098._8_4_ = iVar6;
  local_1098._12_4_ = iVar6;
  auVar51 = ZEXT1664(local_1098);
  iVar6 = (tray->tfar).field_0.i[k];
  auVar28 = ZEXT1664(CONCAT412(iVar6,CONCAT48(iVar6,CONCAT44(iVar6,iVar6))));
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  local_10a8._0_4_ = fVar3 * -local_1008;
  local_10a8._4_4_ = fVar3 * -local_1008;
  local_10a8._8_4_ = fVar3 * -local_1008;
  local_10a8._12_4_ = fVar3 * -local_1008;
  auVar53 = ZEXT1664(local_10a8);
  local_10b8._0_4_ = fVar4 * -fVar1;
  local_10b8._4_4_ = fVar4 * -fVar1;
  local_10b8._8_4_ = fVar4 * -fVar1;
  local_10b8._12_4_ = fVar4 * -fVar1;
  auVar55 = ZEXT1664(local_10b8);
  local_10c8._0_4_ = fVar5 * -fVar2;
  local_10c8._4_4_ = fVar5 * -fVar2;
  local_10c8._8_4_ = fVar5 * -fVar2;
  local_10c8._12_4_ = fVar5 * -fVar2;
  auVar56 = ZEXT1664(local_10c8);
  local_10d0 = ray;
  local_10e0 = k;
  local_10f0 = uVar24;
  uVar25 = uVar24;
LAB_01597f59:
  do {
    do {
      if (pauVar27 == (undefined1 (*) [16])&local_f78) {
        return;
      }
      pauVar17 = pauVar27 + -1;
      pauVar27 = pauVar27 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar17 + 8));
    uVar19 = *(ulong *)*pauVar27;
    while ((uVar19 & 8) == 0) {
      fVar1 = *(float *)(ray + k * 4 + 0x70);
      uVar18 = (uint)uVar19 & 7;
      uVar23 = uVar19 & 0xfffffffffffffff0;
      if (uVar18 == 3) {
        local_fd8 = *(undefined1 (*) [16])(uVar23 + 0x20);
        local_fc8 = *(undefined1 (*) [16])(uVar23 + 0x30);
        local_ff8 = *(undefined1 (*) [16])(uVar23 + 0x50);
        local_fe8 = *(undefined1 (*) [16])(uVar23 + 0x60);
        auVar30 = *(undefined1 (*) [16])(uVar23 + 0x80);
        auVar12 = *(undefined1 (*) [16])(uVar23 + 0x90);
        fStack_f8c = 1.0 - fVar1;
        auVar31._4_4_ = fStack_f8c;
        auVar31._0_4_ = fStack_f8c;
        auVar31._8_4_ = fStack_f8c;
        auVar31._12_4_ = fStack_f8c;
        auVar52._0_4_ = fVar1 * *(float *)(uVar23 + 0xe0);
        auVar52._4_4_ = fVar1 * *(float *)(uVar23 + 0xe4);
        auVar52._8_4_ = fVar1 * *(float *)(uVar23 + 0xe8);
        auVar52._12_4_ = fVar1 * *(float *)(uVar23 + 0xec);
        auVar54._0_4_ = fVar1 * *(float *)(uVar23 + 0xf0);
        auVar54._4_4_ = fVar1 * *(float *)(uVar23 + 0xf4);
        auVar54._8_4_ = fVar1 * *(float *)(uVar23 + 0xf8);
        auVar54._12_4_ = fVar1 * *(float *)(uVar23 + 0xfc);
        auVar46._0_4_ = fVar1 * *(float *)(uVar23 + 0x100);
        auVar46._4_4_ = fVar1 * *(float *)(uVar23 + 0x104);
        auVar46._8_4_ = fVar1 * *(float *)(uVar23 + 0x108);
        auVar46._12_4_ = fVar1 * *(float *)(uVar23 + 0x10c);
        auVar32 = ZEXT816(0) << 0x40;
        auVar14 = vfmadd231ps_fma(auVar52,auVar31,auVar32);
        auVar15 = vfmadd231ps_fma(auVar54,auVar31,auVar32);
        local_f88 = vfmadd231ps_fma(auVar46,auVar31,auVar32);
        local_fb8 = fStack_f8c + fVar1 * *(float *)(uVar23 + 0x110);
        fStack_fb4 = fStack_f8c + fVar1 * *(float *)(uVar23 + 0x114);
        fStack_fb0 = fStack_f8c + fVar1 * *(float *)(uVar23 + 0x118);
        fStack_fac = fStack_f8c + fVar1 * *(float *)(uVar23 + 0x11c);
        local_fa8 = fVar1 * *(float *)(uVar23 + 0x120) + fStack_f8c;
        fStack_fa4 = fVar1 * *(float *)(uVar23 + 0x124) + fStack_f8c;
        fStack_fa0 = fVar1 * *(float *)(uVar23 + 0x128) + fStack_f8c;
        fStack_f9c = fVar1 * *(float *)(uVar23 + 300) + fStack_f8c;
        local_f98 = fStack_f8c + fVar1 * *(float *)(uVar23 + 0x130);
        fStack_f94 = fStack_f8c + fVar1 * *(float *)(uVar23 + 0x134);
        fStack_f90 = fStack_f8c + fVar1 * *(float *)(uVar23 + 0x138);
        fStack_f8c = fStack_f8c + fVar1 * *(float *)(uVar23 + 0x13c);
        auVar32._0_4_ = local_1058 * auVar30._0_4_;
        auVar32._4_4_ = fStack_1054 * auVar30._4_4_;
        auVar32._8_4_ = fStack_1050 * auVar30._8_4_;
        auVar32._12_4_ = fStack_104c * auVar30._12_4_;
        auVar40._0_4_ = local_1058 * auVar12._0_4_;
        auVar40._4_4_ = fStack_1054 * auVar12._4_4_;
        auVar40._8_4_ = fStack_1050 * auVar12._8_4_;
        auVar40._12_4_ = fStack_104c * auVar12._12_4_;
        auVar16._4_4_ = uStack_1044;
        auVar16._0_4_ = local_1048;
        auVar16._8_4_ = uStack_1040;
        auVar16._12_4_ = uStack_103c;
        auVar31 = vfmadd231ps_fma(auVar32,auVar16,local_ff8);
        auVar32 = vfmadd231ps_fma(auVar40,auVar16,local_fe8);
        auVar11._4_4_ = uStack_1034;
        auVar11._0_4_ = local_1038;
        auVar11._8_4_ = uStack_1030;
        auVar11._12_4_ = uStack_102c;
        auVar13 = vfmadd231ps_fma(auVar31,auVar11,local_fd8);
        auVar32 = vfmadd231ps_fma(auVar32,auVar11,local_fc8);
        auVar36._8_4_ = 0x7fffffff;
        auVar36._0_8_ = 0x7fffffff7fffffff;
        auVar36._12_4_ = 0x7fffffff;
        auVar31 = vandps_avx(auVar13,auVar36);
        auVar42._8_4_ = 0x219392ef;
        auVar42._0_8_ = 0x219392ef219392ef;
        auVar42._12_4_ = 0x219392ef;
        auVar31 = vcmpps_avx(auVar31,auVar42,1);
        auVar13 = vblendvps_avx(auVar13,auVar42,auVar31);
        auVar31 = vandps_avx(auVar32,auVar36);
        auVar31 = vcmpps_avx(auVar31,auVar42,1);
        auVar40 = vblendvps_avx(auVar32,auVar42,auVar31);
        auVar31 = *(undefined1 (*) [16])(uVar23 + 0xa0);
        auVar33._0_4_ = local_1058 * auVar31._0_4_;
        auVar33._4_4_ = fStack_1054 * auVar31._4_4_;
        auVar33._8_4_ = fStack_1050 * auVar31._8_4_;
        auVar33._12_4_ = fStack_104c * auVar31._12_4_;
        auVar32 = vfmadd231ps_fma(auVar33,auVar16,*(undefined1 (*) [16])(uVar23 + 0x70));
        auVar16 = vfmadd231ps_fma(auVar32,auVar11,*(undefined1 (*) [16])(uVar23 + 0x40));
        auVar32 = vandps_avx(auVar16,auVar36);
        auVar32 = vcmpps_avx(auVar32,auVar42,1);
        auVar32 = vblendvps_avx(auVar16,auVar42,auVar32);
        auVar16 = vrcpps_avx(auVar13);
        auVar34._8_4_ = 0x3f800000;
        auVar34._0_8_ = 0x3f8000003f800000;
        auVar34._12_4_ = 0x3f800000;
        auVar13 = vfnmadd213ps_fma(auVar13,auVar16,auVar34);
        auVar16 = vfmadd132ps_fma(auVar13,auVar16,auVar16);
        auVar13 = vrcpps_avx(auVar40);
        auVar40 = vfnmadd213ps_fma(auVar40,auVar13,auVar34);
        auVar11 = vfmadd132ps_fma(auVar40,auVar13,auVar13);
        auVar13 = vrcpps_avx(auVar32);
        auVar32 = vfnmadd213ps_fma(auVar32,auVar13,auVar34);
        auVar33 = vfmadd132ps_fma(auVar32,auVar13,auVar13);
        auVar30 = vfmadd213ps_fma(auVar30,local_1028,*(undefined1 (*) [16])(uVar23 + 0xb0));
        auVar32 = vfmadd231ps_fma(auVar30,local_1018,local_ff8);
        auVar30 = vfmadd213ps_fma(auVar12,local_1028,*(undefined1 (*) [16])(uVar23 + 0xc0));
        auVar12 = vfmadd213ps_fma(auVar31,local_1028,*(undefined1 (*) [16])(uVar23 + 0xd0));
        auVar30 = vfmadd231ps_fma(auVar30,local_1018,local_fe8);
        auVar12 = vfmadd231ps_fma(auVar12,local_1018,*(undefined1 (*) [16])(uVar23 + 0x70));
        auVar13._4_4_ = fStack_1004;
        auVar13._0_4_ = local_1008;
        auVar13._8_4_ = fStack_1000;
        auVar13._12_4_ = fStack_ffc;
        auVar31 = vfmadd231ps_fma(auVar32,auVar13,local_fd8);
        auVar32 = vfmadd231ps_fma(auVar30,auVar13,local_fc8);
        auVar40 = vfmadd231ps_fma(auVar12,auVar13,*(undefined1 (*) [16])(uVar23 + 0x40));
        auVar30 = vsubps_avx(auVar14,auVar31);
        auVar51 = ZEXT1664(local_1098);
        auVar12._4_4_ = fStack_fb4;
        auVar12._0_4_ = local_fb8;
        auVar12._8_4_ = fStack_fb0;
        auVar12._12_4_ = fStack_fac;
        auVar12 = vsubps_avx(auVar12,auVar31);
        auVar31 = vsubps_avx(auVar15,auVar32);
        auVar53 = ZEXT1664(local_10a8);
        auVar14._4_4_ = fStack_fa4;
        auVar14._0_4_ = local_fa8;
        auVar14._8_4_ = fStack_fa0;
        auVar14._12_4_ = fStack_f9c;
        auVar32 = vsubps_avx(auVar14,auVar32);
        auVar13 = vsubps_avx(local_f88,auVar40);
        auVar55 = ZEXT1664(local_10b8);
        auVar15._4_4_ = fStack_f94;
        auVar15._0_4_ = local_f98;
        auVar15._8_4_ = fStack_f90;
        auVar15._12_4_ = fStack_f8c;
        auVar40 = vsubps_avx(auVar15,auVar40);
        auVar37._0_4_ = auVar16._0_4_ * auVar30._0_4_;
        auVar37._4_4_ = auVar16._4_4_ * auVar30._4_4_;
        auVar37._8_4_ = auVar16._8_4_ * auVar30._8_4_;
        auVar37._12_4_ = auVar16._12_4_ * auVar30._12_4_;
        auVar49._0_4_ = auVar16._0_4_ * auVar12._0_4_;
        auVar49._4_4_ = auVar16._4_4_ * auVar12._4_4_;
        auVar49._8_4_ = auVar16._8_4_ * auVar12._8_4_;
        auVar49._12_4_ = auVar16._12_4_ * auVar12._12_4_;
        auVar56 = ZEXT1664(local_10c8);
        auVar41._0_4_ = auVar11._0_4_ * auVar31._0_4_;
        auVar41._4_4_ = auVar11._4_4_ * auVar31._4_4_;
        auVar41._8_4_ = auVar11._8_4_ * auVar31._8_4_;
        auVar41._12_4_ = auVar11._12_4_ * auVar31._12_4_;
        auVar45._0_4_ = auVar13._0_4_ * auVar33._0_4_;
        auVar45._4_4_ = auVar13._4_4_ * auVar33._4_4_;
        auVar45._8_4_ = auVar13._8_4_ * auVar33._8_4_;
        auVar45._12_4_ = auVar13._12_4_ * auVar33._12_4_;
        auVar43._0_4_ = auVar11._0_4_ * auVar32._0_4_;
        auVar43._4_4_ = auVar11._4_4_ * auVar32._4_4_;
        auVar43._8_4_ = auVar11._8_4_ * auVar32._8_4_;
        auVar43._12_4_ = auVar11._12_4_ * auVar32._12_4_;
        auVar35._0_4_ = auVar40._0_4_ * auVar33._0_4_;
        auVar35._4_4_ = auVar40._4_4_ * auVar33._4_4_;
        auVar35._8_4_ = auVar40._8_4_ * auVar33._8_4_;
        auVar35._12_4_ = auVar40._12_4_ * auVar33._12_4_;
        auVar30 = vpminsd_avx(auVar41,auVar43);
        auVar12 = vpminsd_avx(auVar45,auVar35);
        auVar30 = vmaxps_avx(auVar30,auVar12);
        auVar13 = vpminsd_avx(auVar37,auVar49);
        auVar32 = vpmaxsd_avx(auVar37,auVar49);
        auVar50 = ZEXT1664(local_1088);
        auVar12 = vpmaxsd_avx(auVar41,auVar43);
        auVar31 = vpmaxsd_avx(auVar45,auVar35);
        auVar31 = vminps_avx(auVar12,auVar31);
        auVar12 = vmaxps_avx(local_1098,auVar13);
        auVar48 = ZEXT1664(local_1078);
        local_1108 = vmaxps_avx(auVar12,auVar30);
        auVar47 = ZEXT1664(local_1068);
        auVar30 = vminps_avx(auVar28._0_16_,auVar32);
        auVar30 = vminps_avx(auVar30,auVar31);
        auVar30 = vcmpps_avx(local_1108,auVar30,2);
        uVar18 = vmovmskps_avx(auVar30);
      }
      else {
        auVar29._4_4_ = fVar1;
        auVar29._0_4_ = fVar1;
        auVar29._8_4_ = fVar1;
        auVar29._12_4_ = fVar1;
        auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar25),auVar29,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + uVar25));
        auVar30 = vfmadd213ps_fma(auVar30,auVar47._0_16_,auVar53._0_16_);
        auVar12 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar22),auVar29,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + uVar22));
        auVar12 = vfmadd213ps_fma(auVar12,auVar48._0_16_,auVar55._0_16_);
        auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar26),auVar29,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + uVar26));
        auVar30 = vpmaxsd_avx(auVar30,auVar12);
        auVar12 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + (uVar24 ^ 0x10)),auVar29,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + (uVar24 ^ 0x10)));
        auVar32 = vfmadd213ps_fma(auVar31,auVar50._0_16_,auVar56._0_16_);
        auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + (uVar22 ^ 0x10)),auVar29,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + (uVar22 ^ 0x10)));
        auVar12 = vfmadd213ps_fma(auVar12,auVar47._0_16_,auVar53._0_16_);
        auVar31 = vfmadd213ps_fma(auVar31,auVar48._0_16_,auVar55._0_16_);
        auVar31 = vpminsd_avx(auVar12,auVar31);
        auVar12 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + (uVar26 ^ 0x10)),auVar29,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + (uVar26 ^ 0x10)));
        auVar13 = vfmadd213ps_fma(auVar12,auVar50._0_16_,auVar56._0_16_);
        auVar12 = vpmaxsd_avx(auVar32,auVar51._0_16_);
        local_1108 = vpmaxsd_avx(auVar30,auVar12);
        auVar30 = vpminsd_avx(auVar13,auVar28._0_16_);
        auVar30 = vpminsd_avx(auVar31,auVar30);
        if (uVar18 == 6) {
          auVar12 = vcmpps_avx(local_1108,auVar30,2);
          auVar30 = vcmpps_avx(*(undefined1 (*) [16])(uVar23 + 0xe0),auVar29,2);
          auVar31 = vcmpps_avx(auVar29,*(undefined1 (*) [16])(uVar23 + 0xf0),1);
          auVar30 = vandps_avx(auVar30,auVar31);
          auVar30 = vandps_avx(auVar30,auVar12);
        }
        else {
          auVar30 = vcmpps_avx(local_1108,auVar30,2);
        }
        auVar30 = vpslld_avx(auVar30,0x1f);
        uVar18 = vmovmskps_avx(auVar30);
      }
      uVar19 = (ulong)uVar18;
      if (uVar19 == 0) goto LAB_01597f59;
      lVar10 = 0;
      for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
        lVar10 = lVar10 + 1;
      }
      uVar18 = uVar18 - 1 & uVar18;
      uVar20 = (ulong)uVar18;
      uVar19 = *(ulong *)(uVar23 + lVar10 * 8);
      if (uVar18 != 0) {
        uVar8 = *(uint *)(local_1108 + lVar10 * 4);
        lVar10 = 0;
        for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
          lVar10 = lVar10 + 1;
        }
        uVar18 = uVar18 - 1 & uVar18;
        uVar21 = (ulong)uVar18;
        uVar20 = *(ulong *)(uVar23 + lVar10 * 8);
        uVar9 = *(uint *)(local_1108 + lVar10 * 4);
        if (uVar18 == 0) {
          if (uVar8 < uVar9) {
            *(ulong *)*pauVar27 = uVar20;
            *(uint *)(*pauVar27 + 8) = uVar9;
            pauVar27 = pauVar27 + 1;
          }
          else {
            *(ulong *)*pauVar27 = uVar19;
            *(uint *)(*pauVar27 + 8) = uVar8;
            uVar19 = uVar20;
            pauVar27 = pauVar27 + 1;
          }
        }
        else {
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar19;
          auVar30 = vpunpcklqdq_avx(auVar30,ZEXT416(uVar8));
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar20;
          auVar12 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar9));
          lVar10 = 0;
          for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
            lVar10 = lVar10 + 1;
          }
          uVar18 = uVar18 - 1 & uVar18;
          uVar19 = (ulong)uVar18;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)(uVar23 + lVar10 * 8);
          auVar32 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_1108 + lVar10 * 4)));
          auVar31 = vpcmpgtd_avx(auVar12,auVar30);
          if (uVar18 == 0) {
            auVar13 = vpshufd_avx(auVar31,0xaa);
            auVar31 = vblendvps_avx(auVar12,auVar30,auVar13);
            auVar30 = vblendvps_avx(auVar30,auVar12,auVar13);
            auVar12 = vpcmpgtd_avx(auVar32,auVar31);
            auVar13 = vpshufd_avx(auVar12,0xaa);
            auVar12 = vblendvps_avx(auVar32,auVar31,auVar13);
            auVar31 = vblendvps_avx(auVar31,auVar32,auVar13);
            auVar32 = vpcmpgtd_avx(auVar31,auVar30);
            auVar13 = vpshufd_avx(auVar32,0xaa);
            auVar32 = vblendvps_avx(auVar31,auVar30,auVar13);
            auVar30 = vblendvps_avx(auVar30,auVar31,auVar13);
            *pauVar27 = auVar30;
            pauVar27[1] = auVar32;
            uVar19 = auVar12._0_8_;
            pauVar27 = pauVar27 + 2;
          }
          else {
            lVar10 = 0;
            for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              lVar10 = lVar10 + 1;
            }
            auVar44._8_8_ = 0;
            auVar44._0_8_ = *(ulong *)(uVar23 + lVar10 * 8);
            auVar40 = vpunpcklqdq_avx(auVar44,ZEXT416(*(uint *)(local_1108 + lVar10 * 4)));
            auVar13 = vpshufd_avx(auVar31,0xaa);
            auVar31 = vblendvps_avx(auVar12,auVar30,auVar13);
            auVar30 = vblendvps_avx(auVar30,auVar12,auVar13);
            auVar12 = vpcmpgtd_avx(auVar40,auVar32);
            auVar13 = vpshufd_avx(auVar12,0xaa);
            auVar12 = vblendvps_avx(auVar40,auVar32,auVar13);
            auVar32 = vblendvps_avx(auVar32,auVar40,auVar13);
            auVar13 = vpcmpgtd_avx(auVar32,auVar30);
            auVar40 = vpshufd_avx(auVar13,0xaa);
            auVar13 = vblendvps_avx(auVar32,auVar30,auVar40);
            auVar30 = vblendvps_avx(auVar30,auVar32,auVar40);
            auVar32 = vpcmpgtd_avx(auVar12,auVar31);
            auVar40 = vpshufd_avx(auVar32,0xaa);
            auVar32 = vblendvps_avx(auVar12,auVar31,auVar40);
            auVar12 = vblendvps_avx(auVar31,auVar12,auVar40);
            auVar31 = vpcmpgtd_avx(auVar13,auVar12);
            auVar40 = vpshufd_avx(auVar31,0xaa);
            auVar31 = vblendvps_avx(auVar13,auVar12,auVar40);
            auVar12 = vblendvps_avx(auVar12,auVar13,auVar40);
            *pauVar27 = auVar30;
            pauVar27[1] = auVar12;
            pauVar27[2] = auVar31;
            uVar19 = auVar32._0_8_;
            pauVar27 = pauVar27 + 3;
          }
        }
      }
    }
    (**(code **)((long)local_10e8->leafIntersector +
                (ulong)*(byte *)(uVar19 & 0xfffffffffffffff0) * 0x40 + 0x10))
              (local_10d8,ray,k,context);
    auVar56 = ZEXT1664(local_10c8);
    auVar55 = ZEXT1664(local_10b8);
    auVar53 = ZEXT1664(local_10a8);
    auVar51 = ZEXT1664(local_1098);
    auVar50 = ZEXT1664(local_1088);
    auVar48 = ZEXT1664(local_1078);
    auVar47 = ZEXT1664(local_1068);
    uVar7 = *(undefined4 *)(local_10d0 + local_10e0 * 4 + 0x80);
    auVar28 = ZEXT1664(CONCAT412(uVar7,CONCAT48(uVar7,CONCAT44(uVar7,uVar7))));
    ray = local_10d0;
    k = local_10e0;
    uVar25 = local_10f0;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }